

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O3

void __thiscall
fizplex::ColMatrix_MatrixMultiplicationWithIdentity_Test::TestBody
          (ColMatrix_MatrixMultiplicationWithIdentity_Test *this)

{
  void *pvVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  initializer_list<fizplex::SVector::Nonzero> l_01;
  initializer_list<fizplex::SVector> colList;
  AssertionResult gtest_ar;
  ColMatrix m;
  ColMatrix idnt;
  long alStack_158 [3];
  undefined1 local_140 [48];
  SVector local_110;
  Nonzero local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  Nonzero local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ColMatrix local_98;
  ColMatrix local_70;
  Nonzero local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  alStack_158[1] = 0x15fcd4;
  ColMatrix::identity(&local_70,3);
  local_d8 = 1;
  uStack_d0 = 0;
  local_e8 = 2;
  uStack_e0 = 0xc008000000000000;
  local_f8.index = 0;
  local_f8.value = 7.0;
  alStack_158[1] = 0x15fd0b;
  l._M_len = 3;
  l._M_array = &local_f8;
  SVector::SVector((SVector *)local_140,l);
  local_a8 = 2;
  uStack_a0 = 0x4010000000000000;
  local_b8 = 1;
  uStack_b0 = 0x4008000000000000;
  local_c8.index = 0;
  local_c8.value = 2.0;
  alStack_158[1] = 0x15fd45;
  l_00._M_len = 3;
  l_00._M_array = &local_c8;
  SVector::SVector((SVector *)(local_140 + 0x18),l_00);
  local_28 = 2;
  uStack_20 = 0xc000000000000000;
  local_38 = 1;
  puStack_30 = &DAT_bff0000000000000;
  local_48.index = 0;
  local_48.value = 1.0;
  alStack_158[1] = 0x15fd7f;
  l_01._M_len = 3;
  l_01._M_array = &local_48;
  SVector::SVector(&local_110,l_01);
  alStack_158[1] = 0x15fda1;
  colList._M_len = 3;
  colList._M_array = (iterator)local_140;
  ColMatrix::ColMatrix(&local_98,3,3,colList);
  lVar3 = 0x48;
  do {
    pvVar1 = *(void **)((long)alStack_158 + lVar3);
    if (pvVar1 != (void *)0x0) {
      alStack_158[1] = 0x15fdbc;
      operator_delete(pvVar1,*(long *)((long)alStack_158 + lVar3 + 0x10) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  alStack_158[1] = 0x15fddc;
  ColMatrix::operator*((ColMatrix *)local_140,&local_70,&local_98);
  alStack_158[1] = 0x15fe01;
  testing::internal::CmpHelperEQ<fizplex::ColMatrix,fizplex::ColMatrix>
            ((internal *)&local_f8,"m","idnt * m",&local_98,(ColMatrix *)local_140);
  alStack_158[1] = 0x15fe0b;
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector
            ((vector<fizplex::SVector,_std::allocator<fizplex::SVector>_> *)local_140);
  if ((char)local_f8.index == '\0') {
    alStack_158[1] = 0x15fe20;
    testing::Message::Message((Message *)local_140);
    if ((undefined8 *)local_f8.value == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_f8.value;
    }
    alStack_158[1] = 0x15fe54;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x69,pcVar4);
    alStack_158[1] = 0x15fe66;
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_140);
    alStack_158[1] = 0x15fe73;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      alStack_158[1] = 0x15fe85;
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((pointer)local_140._0_8_ != (pointer)0x0)) {
        alStack_158[1] = 0x15fe99;
        (**(code **)(*(long *)local_140._0_8_ + 8))();
      }
    }
  }
  alStack_158[1] = 0x15fea5;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8.value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  alStack_158[1] = 0x15febf;
  ColMatrix::operator*((ColMatrix *)local_140,&local_98,&local_70);
  alStack_158[1] = 0x15fee4;
  testing::internal::CmpHelperEQ<fizplex::ColMatrix,fizplex::ColMatrix>
            ((internal *)&local_f8,"m","m * idnt",&local_98,(ColMatrix *)local_140);
  alStack_158[1] = 0x15feee;
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector
            ((vector<fizplex::SVector,_std::allocator<fizplex::SVector>_> *)local_140);
  if ((char)local_f8.index == '\0') {
    alStack_158[1] = 0x15ff03;
    testing::Message::Message((Message *)local_140);
    if ((undefined8 *)local_f8.value == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_f8.value;
    }
    alStack_158[1] = 0x15ff37;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x6a,pcVar4);
    alStack_158[1] = 0x15ff49;
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_140);
    alStack_158[1] = 0x15ff56;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((pointer)local_140._0_8_ != (pointer)0x0) {
      alStack_158[1] = 0x15ff68;
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        alStack_158[1] = 0x15ff7c;
        (**(code **)(*(long *)local_140._0_8_ + 8))();
      }
    }
  }
  alStack_158[1] = 0x15ff88;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8.value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  alStack_158[1] = 0x15ff95;
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_98.cols);
  alStack_158[1] = 0x15ffa2;
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_70.cols);
  return;
}

Assistant:

TEST(ColMatrix, MatrixMultiplicationWithIdentity) {
  const auto idnt = ColMatrix::identity(3);
  const ColMatrix m(3, 3,
                    {{{0, 7}, {2, -3}, {1, 0.0}},
                     {{0, 2}, {1, 3}, {2, 4}},
                     {{0, 1}, {1, -1}, {2, -2}}});
  EXPECT_EQ(m, idnt * m);
  EXPECT_EQ(m, m * idnt);
}